

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visit.hpp
# Opt level: O0

void mserialize::detail::visit_variant<Visitor,std::ifstream>
               (string_view full_tag,string_view tag,Visitor *visitor,
               basic_ifstream<char,_std::char_traits<char>_> *istream,int max_recursion)

{
  VariantBegin VVar1;
  string_view x;
  bool bVar2;
  Visitor *in_R8;
  ifstream *in_R9;
  string_view sVar3;
  undefined4 in_stack_00000008;
  undefined4 in_stack_0000000c;
  Visitor *in_stack_00000010;
  undefined1 in_stack_00000018 [16];
  undefined1 in_stack_00000028 [16];
  int in_stack_00000040;
  bool skip;
  string_view option_tag;
  uint8_t preceding_tag_count;
  uint8_t discriminator;
  undefined4 in_stack_ffffffffffffff18;
  uint uVar4;
  undefined4 in_stack_ffffffffffffff1c;
  undefined4 uVar5;
  uchar *in_stack_ffffffffffffff20;
  string_view *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff40;
  size_t in_stack_ffffffffffffff48;
  char *in_stack_ffffffffffffff50;
  size_t in_stack_ffffffffffffff58;
  string_view *local_58;
  size_t local_50;
  byte local_32;
  byte local_31;
  string_view local_20 [2];
  
  string_view::remove_prefix(local_20,1);
  string_view::remove_suffix(local_20,1);
  deserialize<unsigned_char,std::ifstream>
            (in_stack_ffffffffffffff20,
             (basic_ifstream<char,_std::char_traits<char>_> *)
             CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  local_32 = local_31;
  while (local_32 != 0) {
    tag_pop(in_stack_ffffffffffffff30);
    local_32 = local_32 - 1;
  }
  sVar3 = tag_pop(in_stack_ffffffffffffff30);
  local_58 = (string_view *)sVar3._ptr;
  local_50 = sVar3._len;
  uVar4 = (uint)local_31;
  uVar5 = 0;
  VVar1.tag._ptr = (char *)local_58;
  VVar1.discriminator = (ulong)uVar4;
  VVar1.tag._len = local_50;
  bVar2 = Visitor::visit<mserialize::Visitor::VariantBegin>(in_R8,VVar1,in_R9);
  if (!bVar2) {
    string_view::string_view(local_58,(char *)CONCAT44(uVar5,uVar4));
    x._len = in_stack_ffffffffffffff58;
    x._ptr = in_stack_ffffffffffffff50;
    sVar3._len = in_stack_ffffffffffffff48;
    sVar3._ptr = in_stack_ffffffffffffff40;
    bVar2 = mserialize::operator==(x,sVar3);
    if (bVar2) {
      Visitor::visit<mserialize::Visitor::Null>(in_R8);
    }
    else {
      visit_impl<Visitor,std::ifstream>
                ((string_view)in_stack_00000028,(string_view)in_stack_00000018,in_stack_00000010,
                 (basic_ifstream<char,_std::char_traits<char>_> *)
                 CONCAT44(in_stack_0000000c,in_stack_00000008),in_stack_00000040);
    }
    Visitor::visit<mserialize::Visitor::VariantEnd>(in_R8);
  }
  return;
}

Assistant:

void visit_variant(const string_view full_tag, string_view tag, Visitor& visitor, InputStream& istream, int max_recursion)
{
  tag.remove_prefix(1); // drop <
  tag.remove_suffix(1); // drop >

  std::uint8_t discriminator;
  mserialize::deserialize(discriminator, istream);

  std::uint8_t preceding_tag_count = discriminator;
  while (preceding_tag_count--) { tag_pop(tag); }

  const string_view option_tag = tag_pop(tag);

  const bool skip = visitor.visit(mserialize::Visitor::VariantBegin{discriminator, option_tag}, istream);
  if (skip) { return; }

  if (option_tag == "0")
  {
    visitor.visit(mserialize::Visitor::Null{});
  }
  else
  {
    visit_impl(full_tag, option_tag, visitor, istream, max_recursion);
  }

  visitor.visit(mserialize::Visitor::VariantEnd{});
}